

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O1

int Exorcism(Vec_Wec_t *vEsop,int nIns,int nOuts,char *pFileNameOut)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  timespec ts;
  timespec local_408 [62];
  
  if (nIns < 1) {
    __assert_fail("nIns > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exor.c"
                  ,0x29a,"int Exorcism(Vec_Wec_t *, int, int, char *)");
  }
  g_CoverInfo.nWordsIn = (((uint)nIns >> 4) + 1) - (uint)((nIns & 0xfU) == 0);
  g_CoverInfo.nWordsOut = ((int)((ulong)(long)nOuts >> 5) + 1) - (uint)((nOuts & 0x1fU) == 0);
  g_CoverInfo.cIDs = 1;
  g_CoverInfo.nVarsIn = nIns;
  g_CoverInfo.nVarsOut = nOuts;
  iVar1 = clock_gettime(3,local_408);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_408[0].tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_408[0].tv_sec * -1000000;
  }
  g_CoverInfo.nCubesBefore = vEsop->nSize;
  iVar1 = clock_gettime(3,local_408);
  if (iVar1 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_408[0].tv_nsec / 1000 + local_408[0].tv_sec * 1000000;
  }
  g_CoverInfo.TimeStart = lVar5 + lVar4;
  if (g_CoverInfo.Verbosity != 0) {
    printf("Starting cover generation time is %.2f sec\n",
           (double)((float)g_CoverInfo.TimeStart / 1e+06));
    printf("The number of cubes in the starting cover is %d\n",(ulong)(uint)g_CoverInfo.nCubesBefore
          );
  }
  if (g_CoverInfo.nCubesBefore < 0x4e21) {
    g_CoverInfo.nCubesAlloc = g_CoverInfo.nCubesBefore + 0x21;
    iVar1 = AllocateCover(g_CoverInfo.nCubesAlloc,g_CoverInfo.nWordsIn,g_CoverInfo.nWordsOut);
    if (((iVar1 != 0) &&
        (iVar2 = AllocateCubeSets(g_CoverInfo.nVarsIn,g_CoverInfo.nVarsOut), iVar2 != 0)) &&
       (iVar3 = AllocateQueques((uint)((ulong)(uint)(g_CoverInfo.nCubesAlloc *
                                                    g_CoverInfo.nCubesAlloc) * 0x66666667 >> 0x23)),
       iVar3 != 0)) {
      if (g_CoverInfo.Verbosity != 0) {
        printf("Dynamically allocated memory is %dK\n",(ulong)(uint)((iVar2 + iVar1 + iVar3) / 1000)
              );
      }
      clock_gettime(3,local_408);
      if (g_CoverInfo.Verbosity != 0) {
        puts("Generating the starting cover...");
      }
      AddCubesToStartingCover(vEsop);
      if (g_CoverInfo.Verbosity != 0) {
        puts("Performing minimization...");
      }
      iVar1 = clock_gettime(3,local_408);
      if (iVar1 < 0) {
        lVar4 = 1;
      }
      else {
        lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_408[0].tv_nsec),8);
        lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_408[0].tv_sec * -1000000;
      }
      ReduceEsopCover();
      iVar1 = clock_gettime(3,local_408);
      if (iVar1 < 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = local_408[0].tv_nsec / 1000 + local_408[0].tv_sec * 1000000;
      }
      g_CoverInfo.TimeMin = lVar5 + lVar4;
      if (g_CoverInfo.Verbosity != 0) {
        printf("\nMinimization time is %.2f sec\n",(double)((float)g_CoverInfo.TimeMin / 1e+06));
        printf("\nThe number of cubes after minimization is %d\n",
               (ulong)(uint)g_CoverInfo.nCubesInUse);
      }
      pcVar6 = "temp.esop";
      if (pFileNameOut != (char *)0x0) {
        pcVar6 = pFileNameOut;
      }
      strcpy((char *)local_408,pcVar6);
      WriteResultIntoFile((char *)local_408);
      printf("Minimized cover has been written into file <%s>\n",local_408);
      DelocateCubeSets();
      DelocateCover();
      DelocateQueques();
      return 1;
    }
    pcVar6 = "Unexpected memory allocation problem. Quitting...";
  }
  else {
    pcVar6 = "\nThe size of the starting cover is more than 20000 cubes. Quitting...";
  }
  puts(pcVar6);
  return 0;
}

Assistant:

int Exorcism( Vec_Wec_t * vEsop, int nIns, int nOuts, char * pFileNameOut )
{
    abctime clk1;
    int RemainderBits;
    int TotalWords;
    int MemTemp, MemTotal;

    ///////////////////////////////////////////////////////////////////////
    // STEPS of HEURISTIC ESOP MINIMIZATION
    ///////////////////////////////////////////////////////////////////////
    ///////////////////////////////////////////////////////////////////////
    // STEP 1: determine the size of the starting cover
    ///////////////////////////////////////////////////////////////////////
    assert( nIns > 0 );
    // inputs
    RemainderBits = (nIns*2)%(sizeof(unsigned)*8);
    TotalWords    = (nIns*2)/(sizeof(unsigned)*8) + (RemainderBits > 0);
    g_CoverInfo.nVarsIn  = nIns;
    g_CoverInfo.nWordsIn = TotalWords;
    // outputs
    RemainderBits = (nOuts)%(sizeof(unsigned)*8);
    TotalWords    = (nOuts)/(sizeof(unsigned)*8) + (RemainderBits > 0);
    g_CoverInfo.nVarsOut  = nOuts;
    g_CoverInfo.nWordsOut = TotalWords;
    g_CoverInfo.cIDs = 1;

    // cubes
    clk1 = Abc_Clock();
//  g_CoverInfo.nCubesBefore = CountTermsInPseudoKroneckerCover( g_Func.dd, nOuts );
    g_CoverInfo.nCubesBefore = Vec_WecSize(vEsop);
    g_CoverInfo.TimeStart = Abc_Clock() - clk1;

    if ( g_CoverInfo.Verbosity )
    {
    printf( "Starting cover generation time is %.2f sec\n", TICKS_TO_SECONDS(g_CoverInfo.TimeStart) );
    printf( "The number of cubes in the starting cover is %d\n", g_CoverInfo.nCubesBefore );
    }

    if ( g_CoverInfo.nCubesBefore > 20000 )
    {
        printf( "\nThe size of the starting cover is more than 20000 cubes. Quitting...\n" );
        return 0;
    }

    ///////////////////////////////////////////////////////////////////////
    // STEP 2: prepare internal data structures
    ///////////////////////////////////////////////////////////////////////
    g_CoverInfo.nCubesAlloc = g_CoverInfo.nCubesBefore + ADDITIONAL_CUBES; 

    // allocate cube cover
    MemTotal = 0;
    MemTemp = AllocateCover( g_CoverInfo.nCubesAlloc, g_CoverInfo.nWordsIn, g_CoverInfo.nWordsOut );
    if ( MemTemp == 0 )
    {
        printf( "Unexpected memory allocation problem. Quitting...\n" );
        return 0;
    }
    else 
        MemTotal += MemTemp;

    // allocate cube sets
    MemTemp = AllocateCubeSets( g_CoverInfo.nVarsIn, g_CoverInfo.nVarsOut );
    if ( MemTemp == 0 )
    {
        printf( "Unexpected memory allocation problem. Quitting...\n" );
        return 0;
    }
    else 
        MemTotal += MemTemp;

    // allocate adjacency queques
    MemTemp = AllocateQueques( g_CoverInfo.nCubesAlloc*g_CoverInfo.nCubesAlloc/CUBE_PAIR_FACTOR );
    if ( MemTemp == 0 )
    {
        printf( "Unexpected memory allocation problem. Quitting...\n" );
        return 0;
    }
    else 
        MemTotal += MemTemp;

    if ( g_CoverInfo.Verbosity )
    printf( "Dynamically allocated memory is %dK\n",  MemTotal/1000 );

    ///////////////////////////////////////////////////////////////////////
    // STEP 3: write the cube cover into the allocated storage
    ///////////////////////////////////////////////////////////////////////
    ///////////////////////////////////////////////////////////////////////
    clk1 = Abc_Clock();
    if ( g_CoverInfo.Verbosity )
    printf( "Generating the starting cover...\n" );
    AddCubesToStartingCover( vEsop );
    ///////////////////////////////////////////////////////////////////////

    ///////////////////////////////////////////////////////////////////////
    // STEP 4: iteratively improve the cover 
    ///////////////////////////////////////////////////////////////////////
    if ( g_CoverInfo.Verbosity )
    printf( "Performing minimization...\n" );
    clk1 = Abc_Clock();
    ReduceEsopCover();
    g_CoverInfo.TimeMin = Abc_Clock() - clk1;
//  g_Func.TimeMin = (float)(Abc_Clock() - clk1)/(float)(CLOCKS_PER_SEC);
    if ( g_CoverInfo.Verbosity )
    {
    printf( "\nMinimization time is %.2f sec\n", TICKS_TO_SECONDS(g_CoverInfo.TimeMin) );
    printf( "\nThe number of cubes after minimization is %d\n", g_CoverInfo.nCubesInUse );
    }

    ///////////////////////////////////////////////////////////////////////
    // STEP 5: save the cover into file 
    ///////////////////////////////////////////////////////////////////////
    // if option is MULTI_OUTPUT, the output is written into the output file;
    // if option is SINGLE_NODE, the output is added to the input file
    // and written into the output file; in this case, the minimized nodes is
    // also stored in the temporary file "temp.blif" for verification

    // create the file name and write the output
    {
        char Buffer[1000];
        sprintf( Buffer, "%s", pFileNameOut ? pFileNameOut : "temp.esop" );
        WriteResultIntoFile( Buffer );
        //if ( g_CoverInfo.Verbosity )
        printf( "Minimized cover has been written into file <%s>\n", Buffer );
    }

    ///////////////////////////////////////////////////////////////////////
    // STEP 6: delocate memory
    ///////////////////////////////////////////////////////////////////////
    DelocateCubeSets();
    DelocateCover();
    DelocateQueques();

    // return success
    return 1;
}